

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  string *__lhs;
  char cVar1;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_428;
  string outputFileName;
  FastText fasttext;
  Args a;
  ofstream ofs;
  
  ::fasttext::Args::Args(&a);
  ::fasttext::Args::parseArgs(&a,args);
  ::fasttext::FastText::FastText(&fasttext);
  __lhs = &a.output;
  std::operator+(&outputFileName,__lhs,".bin");
  std::ofstream::ofstream(&ofs,(string *)&outputFileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::close();
    ::fasttext::FastText::train(&fasttext,&a);
    ::fasttext::FastText::saveModel(&fasttext,&outputFileName);
    std::operator+(&bStack_428,__lhs,".vec");
    ::fasttext::FastText::saveVectors(&fasttext,&bStack_428);
    std::__cxx11::string::~string((string *)&bStack_428);
    if (a.saveOutput == true) {
      std::operator+(&bStack_428,__lhs,".output");
      ::fasttext::FastText::saveOutput(&fasttext,&bStack_428);
      std::__cxx11::string::~string((string *)&bStack_428);
    }
    std::ofstream::~ofstream(&ofs);
    std::__cxx11::string::~string((string *)&outputFileName);
    ::fasttext::FastText::~FastText(&fasttext);
    ::fasttext::Args::~Args(&a);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_428,&outputFileName," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)&bStack_428);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  FastText fasttext;
  std::string outputFileName(a.output + ".bin");
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  fasttext.train(a);
  fasttext.saveModel(outputFileName);
  fasttext.saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext.saveOutput(a.output + ".output");
  }
}